

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_vec.cpp
# Opt level: O2

float operator*(vec_3d *a,vec_3d *b)

{
  return a->z * b->z + a->y * b->y + a->x * b->x;
}

Assistant:

float operator*(const vec_3d &a, const vec_3d &b) {
    float result = 0.f;
#ifdef LIBQUAT_ARM
    arm_dot_prod_f32((float *)a, (float *)b, result);
#else
    result = a.x * b.x;
    result += a.y * b.y;
    result += a.z * b.z;
#endif

    return result;
}